

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O3

bool __thiscall csv::CSVField::try_parse_hex(CSVField *this,int *parsedValue)

{
  byte bVar1;
  bool bVar2;
  DataType DVar3;
  ulong uVar4;
  ulong uVar5;
  char extraout_DL;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  char in_R8B;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  undefined1 auVar13 [16];
  string_view in;
  
  uVar9 = (this->sv)._M_len;
  if (uVar9 == 0) {
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    while ((this->sv)._M_str[uVar10] == ' ') {
      uVar10 = uVar10 + 1;
      if (uVar9 == uVar10) {
        return false;
      }
    }
  }
  if (uVar9 <= uVar10) {
    return false;
  }
  uVar4 = uVar10;
  do {
    uVar5 = uVar4;
    if ((this->sv)._M_str[uVar4] == ' ') break;
    uVar4 = uVar4 + 1;
    uVar5 = uVar9;
  } while (uVar9 != uVar4);
  uVar4 = uVar5 - uVar10;
  if (uVar4 == 0) {
    return false;
  }
  if (uVar10 <= uVar9) {
    if (uVar9 - uVar10 < uVar4) {
      uVar4 = uVar9 - uVar10;
    }
    if (uVar4 == 0) {
      iVar6 = 0;
    }
    else {
      pcVar7 = (this->sv)._M_str;
      lVar11 = ~uVar10 + uVar5;
      uVar9 = 0;
      iVar6 = 0;
      do {
        bVar1 = pcVar7[uVar9 + uVar10] - 0x30;
        if (0x36 < bVar1) {
          return false;
        }
        if ((0x7e0000007e03ffU >> ((ulong)bVar1 & 0x3f) & 1) == 0) {
          return false;
        }
        auVar13._8_4_ = (int)((ulong)lVar11 >> 0x20);
        auVar13._0_8_ = lVar11;
        auVar13._12_4_ = 0x45300000;
        dVar12 = exp2(((auVar13._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) * 4.0);
        iVar6 = iVar6 + (int)dVar12 * *(int *)(&DAT_001114b4 + (ulong)bVar1 * 4);
        lVar11 = lVar11 + -1;
        uVar9 = uVar9 + 1;
      } while (uVar4 != uVar9);
    }
    *parsedValue = iVar6;
    return true;
  }
  pcVar8 = "%s: __pos (which is %zu) > __size (which is %zu)";
  pcVar7 = "basic_string_view::substr";
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",uVar10);
  DVar3 = *(DataType *)(pcVar8 + 0x20);
  switch(DVar3) {
  case CSV_NULL:
    goto switchD_00109d59_caseD_0;
  case UNKNOWN:
  case CSV_STRING:
  case CSV_DOUBLE:
    in._M_str = pcVar8;
    in._M_len = *(size_t *)(pcVar8 + 0x18);
    DVar3 = internals::data_type
                      (*(internals **)(pcVar8 + 0x10),in,(longdouble *)(ulong)(uint)(int)extraout_DL
                       ,in_R8B);
    *(DataType *)(pcVar8 + 0x20) = DVar3;
  }
  if ((uint)(DVar3 + ~CSV_STRING) < 6) {
    *(unkbyte10 *)pcVar7 = *(unkbyte10 *)pcVar8;
    bVar2 = true;
  }
  else {
switchD_00109d59_caseD_0:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

CSV_INLINE bool CSVField::try_parse_hex(int& parsedValue) {
        size_t start = 0, end = 0;

        // Trim out whitespace chars
        for (; start < this->sv.size() && this->sv[start] == ' '; start++);
        for (end = start; end < this->sv.size() && this->sv[end] != ' '; end++);
        
        int value_ = 0;

        size_t digits = (end - start);
        size_t base16_exponent = digits - 1;

        if (digits == 0) return false;

        for (const auto& ch : this->sv.substr(start, digits)) {
            int digit = 0;

            switch (ch) {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                digit = static_cast<int>(ch - '0');
                break;
            case 'a':
            case 'A':
                digit = 10;
                break;
            case 'b':
            case 'B':
                digit = 11;
                break;
            case 'c':
            case 'C':
                digit = 12;
                break;
            case 'd':
            case 'D':
                digit = 13;
                break;
            case 'e':
            case 'E':
                digit = 14;
                break;
            case 'f':
            case 'F':
                digit = 15;
                break;
            default:
                return false;
            }

            value_ += digit * (int)pow(16, (double)base16_exponent);
            base16_exponent--;
        }

        parsedValue = value_;
        return true;
    }